

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataStructures.pb.cc
# Opt level: O0

StringVector * __thiscall CoreML::Specification::StringVector::New(StringVector *this,Arena *arena)

{
  StringVector *this_00;
  StringVector *n;
  Arena *arena_local;
  StringVector *this_local;
  
  this_00 = (StringVector *)operator_new(0x30);
  StringVector(this_00);
  if (arena != (Arena *)0x0) {
    google::protobuf::Arena::Own<CoreML::Specification::StringVector>(arena,this_00);
  }
  return this_00;
}

Assistant:

StringVector* StringVector::New(::google::protobuf::Arena* arena) const {
  StringVector* n = new StringVector;
  if (arena != NULL) {
    arena->Own(n);
  }
  return n;
}